

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O0

int extract(Options *param_1,string *name)

{
  byte bVar1;
  type pbVar2;
  pointer pvVar3;
  array<char,_8192UL> buf;
  ostream *ofs;
  basic_istream<char,_std::char_traits<char>_> *ifs;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  data;
  File file;
  File *in_stack_ffffffffffffdef0;
  array<char,_8192UL> *in_stack_ffffffffffffdf00;
  File *in_stack_ffffffffffffdf38;
  string *in_stack_ffffffffffffe258;
  File *in_stack_ffffffffffffe260;
  
  lrit::File::File(in_stack_ffffffffffffe260,in_stack_ffffffffffffe258);
  lrit::File::getData(in_stack_ffffffffffffdf38);
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffdef0);
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    in_stack_ffffffffffffdf00 = (array<char,_8192UL> *)&stack0xffffffffffffdf30;
    pvVar3 = std::array<char,_8192UL>::data((array<char,_8192UL> *)0x16876d);
    std::array<char,_8192UL>::size(in_stack_ffffffffffffdf00);
    std::istream::read((char *)pbVar2,(long)pvVar3);
    in_stack_ffffffffffffdef0 =
         (File *)std::array<char,_8192UL>::data((array<char,_8192UL> *)0x16879a);
    std::istream::gcount();
    std::ostream::write((char *)&std::cout,(long)in_stack_ffffffffffffdef0);
  }
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 *)in_stack_ffffffffffffdf00);
  lrit::File::~File(in_stack_ffffffffffffdef0);
  return 0;
}

Assistant:

int extract(const Options&, const std::string& name) {
  auto file = lrit::File(name);

  // Streaming copy from file to standard out
  auto data = file.getData();
  auto& ifs = *data;
  auto& ofs = std::cout;
  std::array<char, 8192> buf;
  while (!ifs.eof()) {
    ifs.read(buf.data(), buf.size());
    ofs.write(buf.data(), ifs.gcount());
  }

  return 0;
}